

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O3

duckdb_state
duckdb_prepare_extracted_statement
          (duckdb_connection connection,duckdb_extracted_statements extracted_statements,idx_t index
          ,duckdb_prepared_statement *out_prepared_statement)

{
  element_type *peVar1;
  bool bVar2;
  duckdb_state dVar3;
  duckdb_prepared_statement p_Var4;
  reference pvVar5;
  pointer this;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  dVar3 = DuckDBError;
  if ((out_prepared_statement != (duckdb_prepared_statement *)0x0 &&
       connection != (duckdb_connection)0x0) &&
     (index < (ulong)(*(long *)(extracted_statements + 8) - *(long *)extracted_statements >> 3))) {
    p_Var4 = (duckdb_prepared_statement)operator_new(0x40);
    *(long *)(p_Var4 + 0x20) = 0;
    *(long *)(p_Var4 + 0x28) = 0;
    *(duckdb_prepared_statement *)p_Var4 = p_Var4 + 0x30;
    *(long *)(p_Var4 + 8) = 1;
    *(long *)(p_Var4 + 0x10) = 0;
    *(long *)(p_Var4 + 0x18) = 0;
    *(undefined4 *)(p_Var4 + 0x20) = 0x3f800000;
    *(long *)(p_Var4 + 0x38) = 0;
    *(long *)(p_Var4 + 0x28) = 0;
    *(long *)(p_Var4 + 0x30) = 0;
    pvVar5 = duckdb::
             vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                           *)extracted_statements,index);
    local_38._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (pvVar5->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
    (pvVar5->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
    _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
    super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
    duckdb::Connection::Prepare
              ((Connection *)&local_40,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               connection);
    peVar1 = local_40;
    local_40 = (element_type *)0x0;
    std::__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
    ::reset((__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
             *)(p_Var4 + 0x38),(pointer)peVar1);
    peVar1 = local_40;
    if (local_40 != (element_type *)0x0) {
      duckdb::PreparedStatement::~PreparedStatement((PreparedStatement *)local_40);
      operator_delete(peVar1);
    }
    local_40 = (element_type *)0x0;
    if ((SQLStatement *)local_38._M_pi != (SQLStatement *)0x0) {
      (*(local_38._M_pi)->_vptr__Sp_counted_base[1])();
    }
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *out_prepared_statement = p_Var4;
    this = duckdb::
           unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
           ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                         *)(p_Var4 + 0x38));
    bVar2 = duckdb::PreparedStatement::HasError(this);
    dVar3 = (duckdb_state)bVar2;
  }
  return dVar3;
}

Assistant:

duckdb_state duckdb_prepare_extracted_statement(duckdb_connection connection,
                                                duckdb_extracted_statements extracted_statements, idx_t index,
                                                duckdb_prepared_statement *out_prepared_statement) {
	Connection *conn = reinterpret_cast<Connection *>(connection);
	auto source_wrapper = (ExtractStatementsWrapper *)extracted_statements;

	if (!connection || !out_prepared_statement || index >= source_wrapper->statements.size()) {
		return DuckDBError;
	}
	auto wrapper = new PreparedStatementWrapper();
	wrapper->statement = conn->Prepare(std::move(source_wrapper->statements[index]));

	*out_prepared_statement = (duckdb_prepared_statement)wrapper;
	return wrapper->statement->HasError() ? DuckDBError : DuckDBSuccess;
}